

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintEnum
          (FieldValuePrinter *this,int32 val,string *name)

{
  StringBaseTextGenerator *this_00;
  string *in_RDI;
  StringBaseTextGenerator generator;
  BaseTextGenerator *in_stack_ffffffffffffff78;
  StringBaseTextGenerator *in_stack_ffffffffffffff80;
  string *this_01;
  StringBaseTextGenerator local_48 [72];
  
  this_01 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_stack_ffffffffffffff80);
  FastFieldValuePrinter::PrintEnum
            ((FastFieldValuePrinter *)this_01,(int32)((ulong)in_RDI >> 0x20),
             (string *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (StringBaseTextGenerator *)
            (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_(local_48);
  std::__cxx11::string::string((string *)in_RDI,(string *)this_00);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return this_01;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintEnum(
    int32 val, const std::string& name) const {
  FORWARD_IMPL(PrintEnum, val, name);
}